

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_array.c
# Opt level: O2

void qcc_generate_array_of(qcc_generator_ptr self,void *data)

{
  qcc_generator_ptr self_00;
  void *data_00;
  qcc_context *pqVar1;
  qcc_uint qVar2;
  ulong uVar3;
  size_t i;
  qcc_context *pqVar4;
  
  self_00 = (qcc_generator_ptr)self[1].generate;
  data_00 = qcc_arena_alloc(self->context->arena,self[1].type_size * self_00->type_size);
  *(void **)data = data_00;
  pqVar1 = self[1].context;
  *(qcc_context **)((long)data + 8) = pqVar1;
  for (pqVar4 = (qcc_context *)0x0; pqVar4 != pqVar1;
      pqVar4 = (qcc_context *)((long)&pqVar4->result + 1)) {
    qcc_generate(self_00,data_00);
    data_00 = (void *)((long)data_00 + self_00->type_size);
    pqVar1 = self[1].context;
  }
  uVar3 = *(ulong *)((long)data + 8);
  while( true ) {
    if (self[1].type_size <= uVar3) {
      return;
    }
    qVar2 = qcc_stream_get(self->context->stream);
    if ((qVar2 & 3) == 0) break;
    qcc_generate(self_00,data_00);
    data_00 = (void *)((long)data_00 + self_00->type_size);
    uVar3 = *(long *)((long)data + 8) + 1;
    *(ulong *)((long)data + 8) = uVar3;
  }
  return;
}

Assistant:

static void qcc_generate_array_of(qcc_generator_ptr self, void *data)
{
    struct qcc_arena *arena = self->context->arena;
    struct qcc_generator_array_of *array_of =
        (struct qcc_generator_array_of *)self;
    qcc_generator_ptr item_gen = array_of->item_gen;

    struct qcc_array *array = (struct qcc_array *)data;
    array->data =
        qcc_arena_alloc(arena, item_gen->type_size * array_of->size.max);
    array->size = array_of->size.min;

    uint8_t *item = (uint8_t *)array->data;
    for (size_t i = 0; i != array_of->size.min; ++i)
    {
        qcc_generate(item_gen, item);
        item += item_gen->type_size;
    }

    while (array->size < array_of->size.max)
    {
        if (qcc_stream_get(self->context->stream) % 4 == 0) break;
        qcc_generate(item_gen, item);
        item += item_gen->type_size;
        ++array->size;
    }
}